

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_tcpdial.c
# Opt level: O0

int tcp_dialer_get_keepalive(void *arg,void *buf,size_t *szp,nni_type t)

{
  byte bVar1;
  int iVar2;
  nni_tcp_dialer *d;
  _Bool b;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0xa8));
  bVar1 = *(byte *)((long)arg + 0x1a);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0xa8));
  iVar2 = nni_copyout_bool((_Bool)(bVar1 & 1),buf,szp,t);
  return iVar2;
}

Assistant:

static int
tcp_dialer_get_keepalive(void *arg, void *buf, size_t *szp, nni_type t)
{
	bool            b;
	nni_tcp_dialer *d = arg;
	nni_mtx_lock(&d->mtx);
	b = d->keepalive;
	nni_mtx_unlock(&d->mtx);
	return (nni_copyout_bool(b, buf, szp, t));
}